

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O2

bool __thiscall
QOpenGLTextureBlitterPrivate::buildProgram
          (QOpenGLTextureBlitterPrivate *this,ProgramIndex idx,char *vs,char *fs)

{
  bool bVar1;
  GLuint GVar2;
  QOpenGLShaderProgram *this_00;
  QDebug *this_01;
  socklen_t __len;
  sockaddr *__addr;
  Program *this_02;
  int __fd;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QArrayDataPointer<char16_t> local_70;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_38;
  long local_30;
  
  __len = (socklen_t)fs;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = this->programs + idx;
  this_00 = (QOpenGLShaderProgram *)operator_new(0x10);
  QOpenGLShaderProgram::QOpenGLShaderProgram(this_00,(QObject *)0x0);
  QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::reset
            (&this_02->glProgram,this_00);
  QOpenGLShaderProgram::addCacheableShaderFromSourceCode((this_02->glProgram).d,(ShaderType)0x1,vs);
  __fd = 2;
  QOpenGLShaderProgram::addCacheableShaderFromSourceCode((this_02->glProgram).d,(ShaderType)0x2,fs);
  (**(code **)(*(long *)(this_02->glProgram).d + 0x60))();
  bVar1 = QOpenGLShaderProgram::isLinked((this_02->glProgram).d);
  if (bVar1) {
    QOpenGLShaderProgram::bind((this_02->glProgram).d,__fd,__addr,__len);
    GVar2 = QOpenGLShaderProgram::attributeLocation((this_02->glProgram).d,"vertexCoord");
    this->programs[idx].vertexCoordAttribPos = GVar2;
    GVar2 = QOpenGLShaderProgram::uniformLocation((this_02->glProgram).d,"vertexTransform");
    this->programs[idx].vertexTransformUniformPos = GVar2;
    GVar2 = QOpenGLShaderProgram::attributeLocation((this_02->glProgram).d,"textureCoord");
    this->programs[idx].textureCoordAttribPos = GVar2;
    GVar2 = QOpenGLShaderProgram::uniformLocation((this_02->glProgram).d,"textureTransform");
    this->programs[idx].textureTransformUniformPos = GVar2;
    GVar2 = QOpenGLShaderProgram::uniformLocation((this_02->glProgram).d,"swizzle");
    this->programs[idx].swizzleUniformPos = GVar2;
    GVar2 = QOpenGLShaderProgram::uniformLocation((this_02->glProgram).d,"opacity");
    this->programs[idx].opacityUniformPos = GVar2;
    QOpenGLShaderProgram::setUniformValue
              ((this_02->glProgram).d,this->programs[idx].swizzleUniformPos,0);
    QOpenGLShaderProgram::release((this_02->glProgram).d);
  }
  else {
    local_58 = 2;
    local_44 = 0;
    local_54 = 0;
    uStack_4c = 0;
    local_40 = "default";
    QMessageLogger::warning();
    this_01 = QDebug::operator<<(&local_38,"Could not link shader program:\n");
    QOpenGLShaderProgram::log
              ((QOpenGLShaderProgram *)&local_70,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)
              );
    QDebug::operator<<(this_01,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QDebug::~QDebug(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTextureBlitterPrivate::buildProgram(ProgramIndex idx, const char *vs, const char *fs)
{
    Program *p = &programs[idx];

    p->glProgram.reset(new QOpenGLShaderProgram);

    p->glProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Vertex, vs);
    p->glProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Fragment, fs);
    p->glProgram->link();
    if (!p->glProgram->isLinked()) {
        qWarning() << "Could not link shader program:\n" << p->glProgram->log();
        return false;
    }

    p->glProgram->bind();

    p->vertexCoordAttribPos = p->glProgram->attributeLocation("vertexCoord");
    p->vertexTransformUniformPos = p->glProgram->uniformLocation("vertexTransform");
    p->textureCoordAttribPos = p->glProgram->attributeLocation("textureCoord");
    p->textureTransformUniformPos = p->glProgram->uniformLocation("textureTransform");
    p->swizzleUniformPos = p->glProgram->uniformLocation("swizzle");
    p->opacityUniformPos = p->glProgram->uniformLocation("opacity");

    p->glProgram->setUniformValue(p->swizzleUniformPos, false);

    // minmize state left set after a create()
    p->glProgram->release();

    return true;
}